

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O0

void duckdb::UniqueFunctor::
     ListExecuteFunction<duckdb::FinalizeGenericValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
  **ppHVar1;
  UnifiedVectorFormat *pUVar2;
  idx_t iVar3;
  SelectionVector *pSVar4;
  ulong in_RDX;
  HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
  *state;
  idx_t i;
  unsigned_long *result_data;
  HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
  **states;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat *this;
  UnifiedVectorFormat *count_00;
  Vector *in_stack_ffffffffffffff70;
  ulong local_88;
  UnifiedVectorFormat local_60;
  ulong local_18;
  
  count_00 = &local_60;
  local_18 = in_RDX;
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_ffffffffffffff70);
  Vector::ToUnifiedFormat((Vector *)states,(idx_t)result_data,(UnifiedVectorFormat *)i);
  ppHVar1 = UnifiedVectorFormat::
            GetData<duckdb::HistogramAggState<duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>*>
                      (&local_60);
  pUVar2 = (UnifiedVectorFormat *)FlatVector::GetData<unsigned_long>((Vector *)0x205f366);
  this = pUVar2;
  for (local_88 = 0; local_88 < local_18; local_88 = local_88 + 1) {
    iVar3 = SelectionVector::get_index(local_60.sel,local_88);
    in_stack_ffffffffffffff70 = (Vector *)ppHVar1[iVar3];
    if (*(OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
          **)in_stack_ffffffffffffff70 ==
        (OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
         *)0x0) {
      (&pUVar2->sel)[local_88] = (SelectionVector *)0x0;
    }
    else {
      pSVar4 = (SelectionVector *)
               OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
               ::size((OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
                       *)0x205f401);
      (&pUVar2->sel)[local_88] = pSVar4;
    }
  }
  Vector::Verify(in_stack_ffffffffffffff70,(idx_t)count_00);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto result_data = FlatVector::GetData<uint64_t>(result);
		for (idx_t i = 0; i < count; i++) {

			auto state = states[sdata.sel->get_index(i)];

			if (!state->hist) {
				result_data[i] = 0;
				continue;
			}
			result_data[i] = state->hist->size();
		}
		result.Verify(count);
	}